

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.h
# Opt level: O1

QByteArray * operator+=(QByteArray *a,DecodedData<const_QString_&> *b)

{
  ArrayOptions *pAVar1;
  Interface *pIVar2;
  Data *pDVar3;
  long lVar4;
  QStringEncoder *pQVar5;
  qsizetype qVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  QStringView QVar10;
  
  lVar8 = (a->d).size;
  pIVar2 = (b->encoder->super_QStringConverter).iface;
  if (pIVar2 == (Interface *)0x0) {
    qVar6 = 0;
  }
  else {
    qVar6 = (*pIVar2->fromUtf16Len)((b->data->d).size);
  }
  lVar8 = qVar6 + lVar8;
  pDVar3 = (a->d).d;
  if (((pDVar3 == (Data *)0x0) ||
      (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((long)((((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
             (pDVar3->super_QArrayData).alloc) - (long)(a->d).ptr) < lVar8)) {
    lVar4 = (a->d).size;
    if (lVar8 < lVar4) {
      lVar8 = lVar4;
    }
    QByteArray::reallocData(a,lVar8,KeepSize);
  }
  pDVar3 = (a->d).d;
  if (pDVar3 != (Data *)0x0) {
    if ((pDVar3->super_QArrayData).alloc != 0) {
      pAVar1 = &(pDVar3->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
    if ((pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2))
    goto LAB_0043e57e;
  }
  QByteArray::reallocData(a,(a->d).size,KeepSize);
LAB_0043e57e:
  pcVar9 = (a->d).ptr + (a->d).size;
  pQVar5 = b->encoder;
  pIVar2 = (pQVar5->super_QStringConverter).iface;
  if (pIVar2 == (Interface *)0x0) {
    (pQVar5->super_QStringConverter).state.invalidChars = 1;
  }
  else {
    QVar10.m_data = (b->data->d).ptr;
    QVar10.m_size = (b->data->d).size;
    pcVar9 = (*pIVar2->fromUtf16)(pcVar9,QVar10,&(pQVar5->super_QStringConverter).state);
  }
  pcVar7 = (a->d).ptr;
  if (pcVar7 == (char *)0x0) {
    pcVar7 = "";
  }
  QByteArray::resize(a,(long)pcVar9 - (long)pcVar7);
  return a;
}

Assistant:

QByteArray &operator+=(QByteArray &a, const QStringEncoder::DecodedData<T> &b)
{
    qsizetype len = a.size() + QConcatenable<QStringEncoder::DecodedData<T>>::size(b);
    a.reserve(len);
    char *it = a.data() + a.size();
    QConcatenable<QStringEncoder::DecodedData<T>>::appendTo(b, it);
    a.resize(qsizetype(it - a.constData())); //may be smaller than len
    return a;
}